

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O3

void __thiscall Json_Move_Test::TestBody(Json_Move_Test *this)

{
  TypedExpectation<std::error_code_()> *this_00;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_01;
  char *message;
  char *in_R9;
  pointer *__ptr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StrictMock<mock_json_callbacks> callbacks;
  void *in_stack_fffffffffffffb28;
  coord local_4d0;
  undefined1 local_4c8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4c0;
  undefined1 local_4b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  AssertHelper local_498;
  parser<callbacks_proxy<mock_json_callbacks>_> local_490;
  _Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  local_3f0;
  _Deque_base<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  local_3e8;
  error_code local_398 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_378;
  size_type local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  coord local_358;
  mock_json_callbacks local_350;
  
  testing::StrictMock<mock_json_callbacks>::StrictMock
            ((StrictMock<mock_json_callbacks> *)&local_350);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&local_350.gmock00_null_value_49.super_UntypedFunctionMockerBase,&local_350);
  local_490.singletons_._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>,_true,_true>
        )(__uniq_ptr_data<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>,_true,_true>
          )&local_350.gmock00_null_value_49;
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                      ((MockSpec<std::error_code_()> *)&local_490,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
                       ,0x8b,"callbacks","null_value ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(this_00,1);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser(&local_490,&local_350,none);
  local_3f0.
  super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
        )(_Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
          )local_490.singletons_._M_t.
           super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
           ._M_head_impl;
  local_490.singletons_._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>,_true,_true>
        )(__uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
          )0x0;
  std::
  _Deque_base<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  ::_Deque_base(&local_3e8,
                (_Deque_base<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
                 *)&local_490.stack_);
  local_398[1]._4_8_ = local_490._108_8_;
  local_398[0]._M_value = local_490.error_._M_value;
  local_398[0]._4_4_ = local_490.error_._4_4_;
  paVar1 = &local_490.string_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490.string_._M_dataplus._M_p == paVar1) {
    local_368._8_8_ = local_490.string_.field_2._8_8_;
    local_378 = &local_368;
  }
  else {
    local_378 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_490.string_._M_dataplus._M_p;
  }
  local_368._M_allocated_capacity._1_7_ = local_490.string_.field_2._M_allocated_capacity._1_7_;
  local_368._M_local_buf[0] = local_490.string_.field_2._M_local_buf[0];
  local_370 = local_490.string_._M_string_length;
  local_490.string_._M_string_length = 0;
  local_490.string_.field_2._M_local_buf[0] = '\0';
  local_358 = local_490.coordinate_;
  local_4a8._M_allocated_capacity._0_4_ = 0x6c756e20;
  local_4a8._M_allocated_capacity._4_2_ = 0x206c;
  local_4b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000006;
  local_4a8._M_local_buf[6] = '\0';
  local_4b8 = (undefined1  [8])&local_4a8;
  local_490.string_._M_dataplus._M_p = (pointer)paVar1;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_4c8,6);
  local_4c0 = &local_4a8;
  this_01 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
            input<pstore::gsl::span<char_const,_1l>>
                      ((parser<callbacks_proxy<mock_json_callbacks>> *)&local_3f0,
                       (span<const_char,__1L> *)local_4c8);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_01);
  if (local_4b8 != (undefined1  [8])&local_4a8) {
    operator_delete((void *)local_4b8,
                    CONCAT17(local_4a8._M_local_buf[7],
                             CONCAT16(local_4a8._M_local_buf[6],
                                      CONCAT24(local_4a8._M_allocated_capacity._4_2_,
                                               local_4a8._M_allocated_capacity._0_4_))) + 1);
  }
  local_4c8[0] = local_398[0]._M_value == 0;
  local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  if (local_398[0]._M_value != 0) {
    testing::Message::Message((Message *)&local_4d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_4b8,(internal *)local_4c8,(AssertionResult *)"p2.has_error ()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x91,(char *)local_4b8);
    testing::internal::AssertHelper::operator=(&local_498,(Message *)&local_4d0);
    testing::internal::AssertHelper::~AssertHelper(&local_498);
    if (local_4b8 != (undefined1  [8])&local_4a8) {
      operator_delete((void *)local_4b8,
                      CONCAT17(local_4a8._M_local_buf[7],
                               CONCAT16(local_4a8._M_local_buf[6],
                                        CONCAT24(local_4a8._M_allocated_capacity._4_2_,
                                                 local_4a8._M_allocated_capacity._0_4_))) + 1);
    }
    if (local_4d0 != (coord)0x0) {
      (**(code **)(*(long *)local_4d0 + 8))();
    }
    if (local_4c0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_4c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c0);
    }
  }
  local_4c8._0_4_ = local_358.column;
  local_4c8._4_4_ = local_358.row;
  local_4d0.column = 7;
  local_4d0.row = 1;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_4b8,"p2.coordinate ()","(json::coord{7U, 1U})",(coord *)local_4c8,
             &local_4d0);
  if (local_4b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_4c8);
    if (local_4b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_4b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x92,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4d0,(Message *)local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4d0);
    if ((coord)local_4c8 != (coord)0x0) {
      (**(code **)(*(long *)local_4c8 + 8))();
    }
  }
  if (local_4b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4b0,local_4b0);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378,local_368._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
            *)&local_3e8);
  if (local_3f0.
      super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
      ._M_head_impl != (singleton_storage<callbacks_proxy<mock_json_callbacks>_> *)0x0) {
    operator_delete((void *)local_3f0.
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
                            ._M_head_impl,0x68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490.string_._M_dataplus._M_p != paVar1) {
    operator_delete(local_490.string_._M_dataplus._M_p,
                    CONCAT71(local_490.string_.field_2._M_allocated_capacity._1_7_,
                             local_490.string_.field_2._M_local_buf[0]) + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  ::~deque(&local_490.stack_.c);
  if (local_490.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
       )0x0) {
    operator_delete((void *)local_490.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
                            ._M_head_impl,0x68);
  }
  mock_json_callbacks::~mock_json_callbacks(&local_350);
  testing::Mock::UnregisterCallReaction(in_stack_fffffffffffffb28);
  return;
}

Assistant:

TEST_F (Json, Move) {
    StrictMock<mock_json_callbacks> callbacks;
    callbacks_proxy<mock_json_callbacks> proxy (callbacks);
    EXPECT_CALL (callbacks, null_value ()).Times (1);

    json::parser<decltype (proxy)> p (proxy);
    // Move to a new parser instance ('p2') from 'p' and make sure that 'p2' is usuable.
    auto p2 = std::move (p);
    p2.input (" null "s).eof ();
    EXPECT_FALSE (p2.has_error ());
    EXPECT_EQ (p2.coordinate (), (json::coord{7U, 1U}));
}